

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::(anonymous_namespace)::set_value_ascii<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char *buf)

{
  bool bVar1;
  size_t source_length;
  char *buf_local;
  uintptr_t header_mask_local;
  unsigned_long *header_local;
  char **dest_local;
  
  source_length = strlen(buf);
  bVar1 = strcpy_insitu<char*,unsigned_long>(dest,header,header_mask,buf,source_length);
  return bVar1;
}

Assistant:

PUGI__FN bool set_value_ascii(String& dest, Header& header, uintptr_t header_mask, char* buf)
	{
	#ifdef PUGIXML_WCHAR_MODE
		char_t wbuf[128];
		assert(strlen(buf) < sizeof(wbuf) / sizeof(wbuf[0]));

		size_t offset = 0;
		for (; buf[offset]; ++offset) wbuf[offset] = buf[offset];

		return strcpy_insitu(dest, header, header_mask, wbuf, offset);
	#else
		return strcpy_insitu(dest, header, header_mask, buf, strlen(buf));
	#endif
	}